

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProcessesView.cpp
# Opt level: O0

void __thiscall ProcessesView::ProcessesView(ProcessesView *this,QWidget *parent)

{
  QStandardItemModel *this_00;
  Worker *signal;
  undefined1 local_130 [12];
  int local_124;
  undefined1 local_120 [4];
  int i;
  QString local_108;
  QString local_f0;
  QString local_d8;
  QString local_c0;
  QString local_a8;
  QString local_90;
  QString local_78;
  QString local_60;
  undefined1 local_48 [8];
  QStringList horizontalHeader;
  QStandardItemModel *model;
  QWidget *parent_local;
  ProcessesView *this_local;
  
  QTreeView::QTreeView(&this->super_QTreeView,parent);
  *(undefined ***)this = &PTR_metaObject_00140db0;
  *(undefined ***)&this->field_0x10 = &PTR__ProcessesView_001410d0;
  this_00 = (QStandardItemModel *)operator_new(0x10);
  QStandardItemModel::QStandardItemModel(this_00,(QObject *)0x0);
  QList<QString>::QList((QList<QString> *)local_48);
  QString::QString(&local_60,"Name of Process");
  QList<QString>::append((QList<QString> *)local_48,&local_60);
  QString::~QString(&local_60);
  QString::QString(&local_78,"Type (C/G)");
  QList<QString>::append((QList<QString> *)local_48,&local_78);
  QString::~QString(&local_78);
  QString::QString(&local_90,"GPU ID");
  QList<QString>::append((QList<QString> *)local_48,&local_90);
  QString::~QString(&local_90);
  QString::QString(&local_a8,"Process ID");
  QList<QString>::append((QList<QString> *)local_48,&local_a8);
  QString::~QString(&local_a8);
  QString::QString(&local_c0,"FB Mem Usage (MB)");
  QList<QString>::append((QList<QString> *)local_48,&local_c0);
  QString::~QString(&local_c0);
  QString::QString(&local_d8,"SM Util (%)");
  QList<QString>::append((QList<QString> *)local_48,&local_d8);
  QString::~QString(&local_d8);
  QString::QString(&local_f0,"GPU Mem Util (%)");
  QList<QString>::append((QList<QString> *)local_48,&local_f0);
  QString::~QString(&local_f0);
  QString::QString(&local_108,"Encoding (%)");
  QList<QString>::append((QList<QString> *)local_48,&local_108);
  QString::~QString(&local_108);
  QString::QString((QString *)local_120,"Decoding (%)");
  QList<QString>::append((QList<QString> *)local_48,(rvalue_ref)local_120);
  QString::~QString((QString *)local_120);
  QStandardItemModel::setHorizontalHeaderLabels((QList *)this_00);
  (**(code **)(*(long *)this + 0x1c8))();
  for (local_124 = 0; local_124 < 9; local_124 = local_124 + 1) {
    QTreeView::resizeColumnToContents((ConnectionType)this);
  }
  QFlags<QAbstractItemView::EditTrigger>::QFlags
            ((QFlags<QAbstractItemView::EditTrigger> *)(local_130 + 8),NoEditTriggers);
  QAbstractItemView::setEditTriggers((QFlags_conflict *)this);
  QAbstractItemView::setAutoScroll(SUB81(this,0));
  QTreeView::setRootIsDecorated(SUB81(this,0));
  signal = InfoProvider::getWorker();
  QObject::connect<void(Worker::*)(),void(ProcessesView::*)()>
            ((Object *)local_130,(offset_in_Worker_to_subr)signal,(Object *)Worker::dataUpdated,0,
             (ConnectionType)this);
  QMetaObject::Connection::~Connection((Connection *)local_130);
  QList<QString>::~QList((QList<QString> *)local_48);
  return;
}

Assistant:

ProcessesView::ProcessesView(QWidget *parent): QTreeView(parent) {
    auto *model = new QStandardItemModel();

    // Column titles
    QStringList horizontalHeader;
    horizontalHeader.append("Name of Process"); // Longer header increases column width so the process names are visible
    horizontalHeader.append("Type (C/G)");
    horizontalHeader.append("GPU ID");
    horizontalHeader.append("Process ID");
    horizontalHeader.append("FB Mem Usage (MB)");
    horizontalHeader.append("SM Util (%)");
    horizontalHeader.append("GPU Mem Util (%)");
    horizontalHeader.append("Encoding (%)");
    horizontalHeader.append("Decoding (%)");

    model->setHorizontalHeaderLabels(horizontalHeader);

    setModel(model);

    for (int i = 0; i < NVSMColumns::columns_count; i++)
        resizeColumnToContents(i);

    setEditTriggers(QAbstractItemView::NoEditTriggers);
    setAutoScroll(false);
    setRootIsDecorated(false);

    connect(InfoProvider::getWorker(), &InfoProvider::Worker::dataUpdated, this, &ProcessesView::onDataUpdated);
}